

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O1

wheelchair_accessible_t parse_wheelchair_accessibility(char *value)

{
  int iVar1;
  wheelchair_accessible_t wVar2;
  
  iVar1 = strcmp(value,"0");
  wVar2 = WA_UNKNOWN;
  if ((iVar1 != 0) && (*value != '\0')) {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      wVar2 = WA_POSSIBLE;
    }
    else {
      iVar1 = strcmp(value,"2");
      wVar2 = WA_NOT_SET - (iVar1 == 0);
    }
  }
  return wVar2;
}

Assistant:

wheelchair_accessible_t parse_wheelchair_accessibility(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return WA_UNKNOWN;
    else if (strcmp(value, "1") == 0)
        return WA_POSSIBLE;
    else if (strcmp(value, "2") == 0)
        return WA_NOT_POSSIBLE;
    else
        return WA_NOT_SET;
}